

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder_internal.h
# Opt level: O2

void __thiscall basist::selector::init_flags(selector *this)

{
  uint32_t i;
  uint32_t uVar1;
  ulong uVar2;
  ulong uVar3;
  uint8_t uVar4;
  uint32_t y;
  uint32_t y_00;
  ulong uVar5;
  uint32_t x;
  uint32_t x_00;
  uint32_t hist [4];
  int local_28 [4];
  
  local_28[0] = 0;
  local_28[1] = 0;
  local_28[2] = 0;
  local_28[3] = 0;
  for (y_00 = 0; y_00 != 4; y_00 = y_00 + 1) {
    for (x_00 = 0; x_00 != 4; x_00 = x_00 + 1) {
      uVar1 = get_selector(this,x_00,y_00);
      local_28[uVar1] = local_28[uVar1] + 1;
    }
  }
  this->m_lo_selector = '\x03';
  this->m_hi_selector = '\0';
  this->m_num_unique_selectors = '\0';
  uVar3 = 3;
  uVar5 = 0;
  uVar4 = '\0';
  for (uVar2 = 0; uVar2 != 4; uVar2 = uVar2 + 1) {
    if (local_28[uVar2] != 0) {
      uVar4 = uVar4 + '\x01';
      this->m_num_unique_selectors = uVar4;
      if (uVar2 < (uVar3 & 0xff)) {
        this->m_lo_selector = (uint8_t)uVar2;
        uVar3 = uVar2 & 0xffffffff;
      }
      if ((uVar5 & 0xff) < uVar2) {
        this->m_hi_selector = (uint8_t)uVar2;
        uVar5 = uVar2 & 0xffffffff;
      }
    }
  }
  return;
}

Assistant:

void init_flags()
		{
			uint32_t hist[4] = { 0, 0, 0, 0 };
			for (uint32_t y = 0; y < 4; y++)
			{
				for (uint32_t x = 0; x < 4; x++)
				{
					uint32_t s = get_selector(x, y);
					hist[s]++;
				}
			}

			m_lo_selector = 3;
			m_hi_selector = 0;
			m_num_unique_selectors = 0;

			for (uint32_t i = 0; i < 4; i++)
			{
				if (hist[i])
				{
					m_num_unique_selectors++;
					if (i < m_lo_selector) m_lo_selector = static_cast<uint8_t>(i);
					if (i > m_hi_selector) m_hi_selector = static_cast<uint8_t>(i);
				}
			}
		}